

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O0

ScopeInfo *
Js::ScopeInfo::SaveOneScopeInfo
          (ByteCodeGenerator *byteCodeGenerator,Scope *scope,ScriptContext *scriptContext)

{
  code *pcVar1;
  anon_class_24_3_37d24867 fn;
  bool bVar2;
  ScopeType SVar3;
  ScopeInfo *pSVar4;
  undefined4 *puVar5;
  FuncInfo *pFVar6;
  Recycler *pRVar7;
  FunctionInfo *pFVar8;
  ScriptContext *pSVar9;
  char16_t *pcVar10;
  bool local_99;
  Scope *local_80;
  MapSymbolData mapSymbolData;
  TrackAllocData local_58;
  ScopeInfo *local_30;
  ScopeInfo *scopeInfo;
  ScriptContext *pSStack_20;
  int count;
  ScriptContext *scriptContext_local;
  Scope *scope_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  pSStack_20 = scriptContext;
  scriptContext_local = (ScriptContext *)scope;
  scope_local = (Scope *)byteCodeGenerator;
  pSVar4 = Scope::GetScopeInfo(scope);
  if (pSVar4 != (ScopeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0x3a,"(scope->GetScopeInfo() == nullptr)",
                                "scope->GetScopeInfo() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  SVar3 = Scope::GetScopeType((Scope *)scriptContext_local);
  if (SVar3 == ScopeType_Global) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
                                ,0x3b,"(scope->GetScopeType() != ScopeType_Global)",
                                "scope->GetScopeType() != ScopeType_Global");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  scopeInfo._4_4_ = Scope::Count((Scope *)scriptContext_local);
  pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
  AddSlotCount((int *)((long)&scopeInfo + 4),pFVar6->argsPlaceHolderSlotCount);
  pRVar7 = ScriptContext::GetRecycler(pSStack_20);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,(long)(int)scopeInfo._4_4_ << 4,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ScopeInfo.cpp"
             ,0x44);
  pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_58);
  mapSymbolData._16_8_ = Memory::Recycler::AllocZero;
  pSVar4 = (ScopeInfo *)new<Memory::Recycler>(0x30,pRVar7,0x473830,0);
  pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
  pFVar8 = FunctionProxy::GetFunctionInfo(&pFVar6->byteCodeFunction->super_FunctionProxy);
  ScopeInfo(pSVar4,pFVar8,scopeInfo._4_4_);
  local_30 = pSVar4;
  SVar3 = Scope::GetScopeType((Scope *)scriptContext_local);
  SetScopeType(pSVar4,SVar3);
  bVar2 = Scope::GetIsDynamic((Scope *)scriptContext_local);
  *(ushort *)&local_30->field_0x10 = *(ushort *)&local_30->field_0x10 & 0xfffe | (ushort)bVar2;
  bVar2 = Scope::GetIsObject((Scope *)scriptContext_local);
  *(ushort *)&local_30->field_0x10 = *(ushort *)&local_30->field_0x10 & 0xfffd | (ushort)bVar2 << 1;
  bVar2 = Scope::GetMustInstantiate((Scope *)scriptContext_local);
  *(ushort *)&local_30->field_0x10 = *(ushort *)&local_30->field_0x10 & 0xfffb | (ushort)bVar2 << 2;
  pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
  pSVar9 = (ScriptContext *)FuncInfo::GetBodyScope(pFVar6);
  local_99 = false;
  if (pSVar9 == scriptContext_local) {
    pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
    local_99 = FuncInfo::GetHasCachedScope(pFVar6);
  }
  *(ushort *)&local_30->field_0x10 =
       *(ushort *)&local_30->field_0x10 & 0xfff7 | (ushort)local_99 << 3;
  bVar2 = Scope::GetHasOwnLocalInClosure((Scope *)scriptContext_local);
  *(ushort *)&local_30->field_0x10 = *(ushort *)&local_30->field_0x10 & 0xffdf | (ushort)bVar2 << 5;
  SVar3 = Scope::GetScopeType((Scope *)scriptContext_local);
  if (SVar3 == ScopeType_FunctionBody) {
    pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
    pFVar8 = FunctionProxy::GetFunctionInfo(&pFVar6->byteCodeFunction->super_FunctionProxy);
    bVar2 = FunctionInfo::IsGenerator(pFVar8);
    *(ushort *)&local_30->field_0x10 =
         *(ushort *)&local_30->field_0x10 & 0xffbf | (ushort)bVar2 << 6;
    pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
    pFVar8 = FunctionProxy::GetFunctionInfo(&pFVar6->byteCodeFunction->super_FunctionProxy);
    bVar2 = FunctionInfo::IsAsync(pFVar8);
    *(ushort *)&local_30->field_0x10 =
         *(ushort *)&local_30->field_0x10 & 0xff7f | (ushort)bVar2 << 7;
    pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
    pFVar8 = FunctionProxy::GetFunctionInfo(&pFVar6->byteCodeFunction->super_FunctionProxy);
    bVar2 = FunctionInfo::IsClassConstructor(pFVar8);
    *(ushort *)&local_30->field_0x10 =
         *(ushort *)&local_30->field_0x10 & 0xfeff | (ushort)bVar2 << 8;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ByteCodePhase);
  if (bVar2) {
    pFVar6 = Scope::GetFunc((Scope *)scriptContext_local);
    pcVar10 = L"";
    if ((*(ushort *)&local_30->field_0x10 >> 1 & 1) != 0) {
      pcVar10 = L"isObject";
    }
    Output::Print(L"\nSave ScopeInfo: %s #symbols: %d %s\n",pFVar6->name,(ulong)scopeInfo._4_4_,
                  pcVar10);
  }
  local_80 = scope_local;
  mapSymbolData.byteCodeGenerator =
       (ByteCodeGenerator *)Scope::GetFunc((Scope *)scriptContext_local);
  mapSymbolData.func._0_4_ = 0;
  fn.scopeInfo = local_30;
  fn.mapSymbolData = (MapSymbolData *)&local_80;
  fn.scope = (Scope *)scriptContext_local;
  Scope::
  ForEachSymbol<Js::ScopeInfo::SaveOneScopeInfo(ByteCodeGenerator*,Scope*,Js::ScriptContext*)::__0>
            ((Scope *)scriptContext_local,fn);
  Scope::SetScopeInfo((Scope *)scriptContext_local,local_30);
  return local_30;
}

Assistant:

ScopeInfo* ScopeInfo::SaveOneScopeInfo(ByteCodeGenerator* byteCodeGenerator, Scope* scope, ScriptContext *scriptContext)
    {
        Assert(scope->GetScopeInfo() == nullptr);
        Assert(scope->GetScopeType() != ScopeType_Global);

        int count = scope->Count();

        // Add argsPlaceHolder which includes same name args and destructuring patterns on parameters
        AddSlotCount(count, scope->GetFunc()->argsPlaceHolderSlotCount);

        ScopeInfo* scopeInfo = RecyclerNewPlusZ(scriptContext->GetRecycler(),
            count * sizeof(SymbolInfo),
            ScopeInfo, scope->GetFunc()->byteCodeFunction->GetFunctionInfo(),/*parent ? parent->GetFunctionInfo() : nullptr,*/ count);
        scopeInfo->SetScopeType(scope->GetScopeType());
        scopeInfo->isDynamic = scope->GetIsDynamic();
        scopeInfo->isObject = scope->GetIsObject();
        scopeInfo->mustInstantiate = scope->GetMustInstantiate();
        scopeInfo->isCached = (scope->GetFunc()->GetBodyScope() == scope) && scope->GetFunc()->GetHasCachedScope();
        scopeInfo->hasLocalInClosure = scope->GetHasOwnLocalInClosure();

        if (scope->GetScopeType() == ScopeType_FunctionBody)
        {
            scopeInfo->isGeneratorFunctionBody = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsGenerator();
            scopeInfo->isAsyncFunctionBody = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsAsync();
            scopeInfo->isClassConstructor = scope->GetFunc()->byteCodeFunction->GetFunctionInfo()->IsClassConstructor();
        }

        TRACE_BYTECODE(_u("\nSave ScopeInfo: %s #symbols: %d %s\n"),
            scope->GetFunc()->name, count,
            scopeInfo->isObject ? _u("isObject") : _u(""));

        MapSymbolData mapSymbolData = { byteCodeGenerator, scope->GetFunc(), 0 };
        scope->ForEachSymbol([&mapSymbolData, scopeInfo, scope](Symbol * sym)
        {
            Assert(scope == sym->GetScope());
            scopeInfo->SaveSymbolInfo(sym, &mapSymbolData);
        });

        scope->SetScopeInfo(scopeInfo);

        return scopeInfo;
    }